

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_last(lyxp_set **UNUSED_args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  uint uVar1;
  int iVar2;
  lyxp_set_type lVar3;
  long lVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  longdouble lVar7;
  
  if ((options & 0x1c) == 0) {
    lVar3 = set->type;
    if ((long)(int)lVar3 != 0) {
      if (lVar3 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
        uVar6 = *(undefined8 *)(&DAT_001fe698 + (long)(int)lVar3 * 8);
      }
      else {
        uVar6 = 0;
      }
      ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Invalid context type %s in %s.",uVar6,"last()");
      return LY_EVALID;
    }
    if (set->used == 0) {
      lyxp_set_free_content(set);
      set->type = LYXP_SET_NUMBER;
      lVar7 = (longdouble)0;
    }
    else {
      lVar7 = (longdouble)set->ctx_size;
      lyxp_set_free_content(set);
      set->type = LYXP_SET_NUMBER;
    }
    (set->val).num = lVar7;
  }
  else {
    uVar1 = set->used;
    if ((ulong)uVar1 != 0) {
      lVar4 = 0;
      do {
        iVar2 = *(int *)((long)&((set->val).nodes)->pos + lVar4);
        uVar5 = 0;
        if (iVar2 == 2) {
LAB_001afe98:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar4) = uVar5;
        }
        else if (iVar2 == -2) {
          uVar5 = 0xffffffff;
          goto LAB_001afe98;
        }
        lVar4 = lVar4 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar4);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_last(struct lyxp_set **UNUSED(args), uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INCTX, print_set_type(set), "last()");
        return LY_EVALID;
    } else if (!set->used) {
        set_fill_number(set, 0);
        return LY_SUCCESS;
    }

    set_fill_number(set, set->ctx_size);
    return LY_SUCCESS;
}